

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.cpp
# Opt level: O3

StateResult __thiscall
anon_unknown.dwarf_28cd::HashSeedStorage::initialize(HashSeedStorage *this,int which)

{
  StateResult SVar1;
  char *__s;
  size_t sVar2;
  quintptr extraout_RDX;
  QSimpleParsedNumber<long_long> QVar3;
  StateResult SVar4;
  StateResult SVar5;
  undefined8 extraout_RDX_00;
  
  __s = getenv("QT_HASH_SEED");
  if (__s != (char *)0x0) {
    sVar2 = strlen(__s);
    QVar3 = qstrntoll(__s,sVar2,10);
    if (0 < QVar3.used) {
      sVar2 = strlen(__s);
      SVar1._8_8_ = qt_qhash_seed.seeds[1]._q_value.super___atomic_base<unsigned_long_long>._M_i;
      SVar1.requestedSeed =
           (quintptr)qt_qhash_seed.seeds[0]._q_value.super___atomic_base<unsigned_long_long>._M_i;
      SVar5._8_8_ = extraout_RDX;
      SVar5.requestedSeed = sVar2;
      if (QVar3.used == sVar2) {
        if (QVar3.result != 0) {
          SVar4.requestedSeed =
               fwrite("QT_HASH_SEED: forced seed value is not 0; ignored.\n",0x33,1,_stderr);
          SVar4._8_8_ = extraout_RDX_00;
          return SVar4;
        }
        goto LAB_001defb0;
      }
    }
  }
  SVar5 = (StateResult)qt_initial_random_value();
  SVar1 = SVar5;
LAB_001defb0:
  qt_qhash_seed.seeds[1]._q_value.super___atomic_base<unsigned_long_long>._M_i = SVar1._8_8_;
  qt_qhash_seed.seeds[0]._q_value.super___atomic_base<unsigned_long_long>._M_i =
       (Type)SVar1.requestedSeed;
  return SVar5;
}

Assistant:

[[maybe_unused]] HashSeedStorage::StateResult HashSeedStorage::initialize(int which) noexcept
{
    StateResult result = { 0, OverriddenByEnvironment };
#ifdef QT_BOOTSTRAPPED
    Q_UNUSED(which);
    Q_UNREACHABLE_RETURN(result);
#else
    // can't use qEnvironmentVariableIntValue (reentrancy)
    const char *seedstr = getenv("QT_HASH_SEED");
    if (seedstr) {
        auto r = qstrntoll(seedstr, strlen(seedstr), 10);
        if (r.used > 0 && size_t(r.used) == strlen(seedstr)) {
            if (r.result) {
                // can't use qWarning here (reentrancy)
                fprintf(stderr, "QT_HASH_SEED: forced seed value is not 0; ignored.\n");
            }

            // we don't have to store to the seed, since it's pre-initialized by
            // the compiler to zero
            return result;
        }
    }

    // update the full seed
    auto x = qt_initial_random_value();
    for (int i = 0; i < SeedCount; ++i) {
        seeds[i].storeRelaxed(x.data[i]);
        if (which == i)
            result.requestedSeed = x.data[i];
    }
    result.state = JustInitialized;
    return result;
#endif
}